

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O0

void __thiscall
HookStateStepOver::ProcessHook
          (HookStateStepOver *this,shared_ptr<Debugger> *debugger,lua_State *L,lua_Debug *ar)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  char *__lhs;
  shared_ptr<Debugger> local_58 [2];
  shared_ptr<Debugger> local_38;
  lua_Debug *local_28;
  lua_Debug *ar_local;
  lua_State *L_local;
  shared_ptr<Debugger> *debugger_local;
  HookStateStepOver *this_local;
  
  local_28 = ar;
  ar_local = (lua_Debug *)L;
  L_local = (lua_State *)debugger;
  debugger_local = (shared_ptr<Debugger> *)this;
  std::shared_ptr<Debugger>::shared_ptr(&local_38,debugger);
  StackLevelBasedState::UpdateStackLevel
            (&this->super_StackLevelBasedState,&local_38,(lua_State *)ar_local,local_28);
  std::shared_ptr<Debugger>::~shared_ptr(&local_38);
  if ((this->super_StackLevelBasedState).newStackLevel <
      (this->super_StackLevelBasedState).oriStackLevel) {
    peVar3 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        debugger);
    Debugger::HandleBreak(peVar3);
  }
  else {
    iVar2 = getDebugEvent(local_28);
    if (((iVar2 == 2) && (iVar2 = getDebugCurrentLine(local_28), iVar2 != this->line)) &&
       ((this->super_StackLevelBasedState).newStackLevel ==
        (this->super_StackLevelBasedState).oriStackLevel)) {
      (*lua_getinfo)((lua_State *)ar_local,"Sl",local_28);
      __lhs = getDebugSource(local_28);
      bVar1 = std::operator==(__lhs,&this->file);
      if ((bVar1) || (this->line == -1)) {
        peVar3 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)debugger);
        Debugger::HandleBreak(peVar3);
        return;
      }
    }
    std::shared_ptr<Debugger>::shared_ptr(local_58,debugger);
    HookState::ProcessHook((HookState *)this,local_58,(lua_State *)ar_local,local_28);
    std::shared_ptr<Debugger>::~shared_ptr(local_58);
  }
  return;
}

Assistant:

void HookStateStepOver::ProcessHook(std::shared_ptr<Debugger> debugger, lua_State* L, lua_Debug* ar)
{
	UpdateStackLevel(debugger, L, ar);
	// step out
	if (newStackLevel < oriStackLevel)
	{
		debugger->HandleBreak();
		return;
	}


	if (getDebugEvent(ar) == LUA_HOOKLINE &&
		getDebugCurrentLine(ar) != line &&
		newStackLevel == oriStackLevel)
	{
		lua_getinfo(L, "Sl", ar);

		if (getDebugSource(ar) == file || line == -1)
		{
			debugger->HandleBreak();
			return;
		}
	}
	StackLevelBasedState::ProcessHook(debugger, L, ar);
}